

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerializer.cpp
# Opt level: O1

ISerializedValue * __thiscall
SimpleSerializer::GetISerializedValue(SimpleSerializer *this,char *propertyName)

{
  _Base_ptr p_Var1;
  size_t sVar2;
  iterator iVar3;
  key_type local_48;
  
  if (this->m_pCurrentObject == (IObject *)0x0) {
    __assert_fail("m_pCurrentObject",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/SimpleSerializer/SimpleSerializer.cpp"
                  ,0x72,
                  "virtual const ISerializedValue *SimpleSerializer::GetISerializedValue(const char *) const"
                 );
  }
  if (propertyName != (char *)0x0) {
    if (this->m_bLoading == false) {
      __assert_fail("m_bLoading",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/SimpleSerializer/SimpleSerializer.cpp"
                    ,0x74,
                    "virtual const ISerializedValue *SimpleSerializer::GetISerializedValue(const char *) const"
                   );
    }
    p_Var1 = (this->m_CurrentSerialization)._M_node;
    if ((_Rb_tree_header *)p_Var1 != &(this->m_map)._M_t._M_impl.super__Rb_tree_header) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      sVar2 = strlen(propertyName);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,propertyName,propertyName + sVar2);
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>
                      *)&p_Var1[1]._M_left,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (iVar3._M_node != (_Base_ptr)&(this->m_CurrentSerialization)._M_node[1]._M_right) {
        return *(ISerializedValue **)(iVar3._M_node + 2);
      }
    }
    return (ISerializedValue *)0x0;
  }
  __assert_fail("propertyName",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/SimpleSerializer/SimpleSerializer.cpp"
                ,0x73,
                "virtual const ISerializedValue *SimpleSerializer::GetISerializedValue(const char *) const"
               );
}

Assistant:

const ISerializedValue* SimpleSerializer::GetISerializedValue(const char* propertyName) const
{
	assert( m_pCurrentObject );
	assert( propertyName );
	assert( m_bLoading );
	const ISerializedValue* pRet = NULL;

	//TSerializationMap::const_iterator found = m_map.find(ownerId);
	if (m_CurrentSerialization != m_map.end())
	{
		TValueGroup::const_iterator propertyFound = m_CurrentSerialization->second.find(propertyName);
		if (propertyFound != m_CurrentSerialization->second.end())
		{
			pRet = propertyFound->second;
		}
	}

	return pRet;
}